

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.cpp
# Opt level: O3

void TestSignalCopy(void)

{
  __sighandler_t __handler;
  bool receiverCalled;
  signal<void_(int,_bool)> sg;
  signal<void_(int,_bool)> sg3;
  signal<void_(int,_bool)> sg2;
  bool local_79;
  signal<void_(int,_bool)> local_78;
  signal<void_(int,_bool)> local_68;
  signal<void_(int,_bool)> local_58;
  bool *local_48;
  char local_40 [8];
  code *local_38;
  code *local_30;
  connection local_28;
  
  TestRunner::StartTest("TestSignalCopy");
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  (local_78._data.
   super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_use_count = 1;
  (local_78._data.
   super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_weak_count = 1;
  (local_78._data.
   super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011a9b0
  ;
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           (local_78._data.
            super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi + 1);
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_use_count = 0;
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_weak_count = 0;
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._M_use_count = 0;
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._M_weak_count = 0;
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[3]._M_use_count = 0;
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[3]._M_weak_count = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &local_78._data.
    super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi[4]._M_use_count =
       local_78._data.
       super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi + 4;
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[4]._vptr__Sp_counted_base =
       (_func_int **)
       (local_78._data.
        super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi + 4);
  local_78._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_48 = &local_79;
  local_79 = false;
  local_40[0] = '\a';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\x01';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = '\0';
  local_30 = std::
             _Function_handler<void_(int,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/balmerdx[P]lsignal/tests/test_basic.cpp:352:44)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(int,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/balmerdx[P]lsignal/tests/test_basic.cpp:352:44)>
             ::_M_manager;
  lsignal::signal<void_(int,_bool)>::connect
            ((signal<void_(int,_bool)> *)&local_28,(int)&local_78,(sockaddr *)&local_48,0);
  lsignal::connection::~connection(&local_28);
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  (local_58._data.
   super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_use_count = 1;
  (local_58._data.
   super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_weak_count = 1;
  (local_58._data.
   super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011a9b0
  ;
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           (local_58._data.
            super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi + 1);
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_use_count = 0;
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_weak_count = 0;
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._M_use_count = 0;
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._M_weak_count = 0;
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[3]._M_use_count = 0;
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[3]._M_weak_count = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &local_58._data.
    super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi[4]._M_use_count =
       local_58._data.
       super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi + 4;
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[4]._vptr__Sp_counted_base =
       (_func_int **)
       (local_58._data.
        super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi + 4);
  local_58._data.
  super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  lsignal::signal<void_(int,_bool)>::operator=(&local_58,&local_78);
  lsignal::signal<void_(int,_bool)>::operator()(&local_58,7,true);
  AssertHelper::VerifyValue(true,local_79,"Receiver2 should be called.");
  local_79 = false;
  lsignal::signal<void_(int,_bool)>::signal(&local_68,(int)&local_78,__handler);
  lsignal::signal<void_(int,_bool)>::operator()(&local_68,7,true);
  AssertHelper::VerifyValue(true,local_79,"Receiver3 should be called.");
  if (local_68._data.
      super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68._data.
               super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_58._data.
      super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58._data.
               super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  if (local_78._data.
      super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78._data.
               super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void TestSignalCopy()
{
	TestRunner::StartTest(MethodName);

	lsignal::signal<void(int, bool)> sg;

	int paramOne = 7;
	bool paramTwo = true;

	bool receiverCalled = false;

	std::function<void(int, bool)> receiver = [=, &receiverCalled](int p0, bool p1)
	{
		receiverCalled = true;

		AssertHelper::VerifyValue(paramOne, p0, "First parameter should be as expected.");
		AssertHelper::VerifyValue(paramTwo, p1, "Second parameter should be as expected.");
	};

	sg.connect(receiver, nullptr);

	lsignal::signal<void(int, bool)> sg2;
	sg2 = sg;
	sg2(paramOne, paramTwo);

	AssertHelper::VerifyValue(true, receiverCalled, "Receiver2 should be called.");

	receiverCalled = false;
	lsignal::signal<void(int, bool)> sg3 = sg;
	sg3(paramOne, paramTwo);

	AssertHelper::VerifyValue(true, receiverCalled, "Receiver3 should be called.");
}